

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

bool __thiscall
Clasp::ClaspBerkmin::bump(ClaspBerkmin *this,Solver *s,WeightLitVec *lits,double adj)

{
  uint uVar1;
  pointer ppVar2;
  uint32 uVar3;
  long lVar4;
  uint uVar5;
  
  ppVar2 = (lits->ebo_).buf;
  uVar1 = (lits->ebo_).size;
  for (lVar4 = 0; (ulong)uVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
    uVar5 = *(uint *)((long)&(ppVar2->first).rep_ + lVar4) >> 2;
    if (((this->order_).nant != true) ||
       ((uVar5 < (s->shared_->varInfo_).ebo_.size &&
        (((s->shared_->varInfo_).ebo_.buf[uVar5].rep & 0x20) != 0)))) {
      uVar3 = Order::decayedScore(&this->order_,uVar5);
      uVar5 = (int)((double)*(int *)((long)&ppVar2->second + lVar4) * adj) + uVar3;
      if (0xfffe < uVar5) {
        uVar5 = 0xffff;
      }
      (this->order_).score.ebo_.buf[*(uint *)((long)&(ppVar2->first).rep_ + lVar4) >> 2].act =
           (uint16)uVar5;
    }
  }
  return true;
}

Assistant:

bool ClaspBerkmin::bump(const Solver& s, const WeightLitVec& lits, double adj) {
	for (WeightLitVec::const_iterator it = lits.begin(), end = lits.end(); it != end; ++it) {
		if (!order_.nant || s.varInfo(it->first.var()).nant()) {
			uint32 xf = order_.decayedScore(it->first.var()) + static_cast<weight_t>(it->second*adj);
			order_.score[it->first.var()].act = (uint16)std::min(xf, UINT32_MAX>>16);
		}
	}
	return true;
}